

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O2

int luv_getaddrinfo(lua_State *L)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  lua_Integer lVar5;
  char *pcVar6;
  uv_getaddrinfo_t *req;
  luv_req_t *plVar7;
  uv_loop_t *loop;
  code *cb;
  uint uVar8;
  uint uVar9;
  addrinfo *hints;
  char *local_70;
  addrinfo hints_s;
  
  iVar1 = lua_type(L,1);
  if (iVar1 < 1) {
    local_70 = (char *)0x0;
  }
  else {
    local_70 = luaL_checklstring(L,1,(size_t *)0x0);
  }
  iVar1 = lua_type(L,2);
  if (iVar1 < 1) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = luaL_checklstring(L,2,(size_t *)0x0);
  }
  iVar1 = 3;
  iVar2 = lua_type(L,3);
  if (iVar2 < 1) {
    hints = (addrinfo *)0x0;
    goto LAB_00149525;
  }
  luaL_checktype(L,3,5);
  hints_s.ai_canonname = (char *)0x0;
  hints_s.ai_next = (addrinfo *)0x0;
  hints_s.ai_addrlen = 0;
  hints_s._20_4_ = 0;
  hints_s.ai_addr = (sockaddr *)0x0;
  hints_s.ai_flags = 0;
  hints_s.ai_family = 0;
  hints_s.ai_socktype = 0;
  hints_s.ai_protocol = 0;
  lua_getfield(L,3,"family");
  iVar2 = lua_isnumber(L,-1);
  if (iVar2 == 0) {
    iVar2 = lua_isstring(L,-1);
    if (iVar2 == 0) {
      iVar2 = lua_type(L,-1);
      if (iVar2 == 0) {
        hints_s._0_8_ = hints_s._0_8_ & 0xffffffff;
      }
      else {
        luaL_argerror(L,3,"family hint must be string if set");
      }
    }
    else {
      pcVar6 = lua_tolstring(L,-1,(size_t *)0x0);
      iVar2 = luv_af_string_to_num(pcVar6);
      hints_s.ai_family = iVar2;
    }
  }
  else {
    lVar5 = lua_tointegerx(L,-1,(int *)0x0);
    hints_s.ai_family = (int)lVar5;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"socktype");
  iVar2 = lua_isnumber(L,-1);
  if (iVar2 == 0) {
    iVar2 = lua_isstring(L,-1);
    if (iVar2 != 0) {
      pcVar6 = lua_tolstring(L,-1,(size_t *)0x0);
      iVar2 = 0;
      if (pcVar6 != (char *)0x0) {
        iVar3 = strcmp(pcVar6,"stream");
        iVar2 = 1;
        if (iVar3 != 0) {
          iVar3 = strcmp(pcVar6,"dgram");
          iVar2 = 2;
          if (iVar3 != 0) {
            iVar3 = strcmp(pcVar6,"seqpacket");
            iVar2 = 5;
            if (iVar3 != 0) {
              iVar3 = strcmp(pcVar6,"raw");
              iVar2 = 3;
              if (iVar3 != 0) {
                iVar2 = strcmp(pcVar6,"rdm");
                iVar2 = (uint)(iVar2 == 0) << 2;
              }
            }
          }
        }
      }
      goto LAB_0014924b;
    }
    iVar2 = lua_type(L,-1);
    if (iVar2 != 0) {
      pcVar4 = "socktype hint must be string if set";
      goto LAB_00149625;
    }
  }
  else {
    lVar5 = lua_tointegerx(L,-1,(int *)0x0);
    iVar2 = (int)lVar5;
LAB_0014924b:
    hints_s.ai_socktype = iVar2;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"protocol");
  iVar2 = lua_isnumber(L,-1);
  if (iVar2 == 0) {
    iVar2 = lua_isstring(L,-1);
    if (iVar2 != 0) {
      pcVar6 = lua_tolstring(L,-1,(size_t *)0x0);
      iVar2 = luv_af_string_to_num(pcVar6);
      if (iVar2 == 0) {
        pcVar4 = "Invalid protocol hint";
LAB_00149625:
        iVar1 = luaL_argerror(L,3,pcVar4);
        return iVar1;
      }
      goto LAB_0014928d;
    }
    iVar2 = lua_type(L,-1);
    if (iVar2 != 0) {
      pcVar4 = "protocol hint must be string if set";
      goto LAB_00149625;
    }
  }
  else {
    lVar5 = lua_tointegerx(L,-1,(int *)0x0);
    iVar2 = (int)lVar5;
LAB_0014928d:
    hints_s.ai_protocol = iVar2;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"addrconfig");
  iVar2 = lua_toboolean(L,-1);
  if (iVar2 == 0) {
    uVar9 = 0;
  }
  else {
    hints_s.ai_flags = 0x20;
    uVar9 = 0x20;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"v4mapped");
  iVar2 = lua_toboolean(L,-1);
  uVar8 = uVar9;
  if (iVar2 != 0) {
    uVar8 = uVar9 | 8;
    hints_s._0_8_ = CONCAT44(hints_s.ai_family,uVar9) | 8;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"all");
  iVar2 = lua_toboolean(L,-1);
  uVar9 = uVar8;
  if (iVar2 != 0) {
    uVar9 = uVar8 | 0x10;
    hints_s._0_8_ = CONCAT44(hints_s.ai_family,uVar8) | 0x10;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"numerichost");
  iVar2 = lua_toboolean(L,-1);
  uVar8 = uVar9;
  if (iVar2 != 0) {
    uVar8 = uVar9 | 4;
    hints_s._0_8_ = CONCAT44(hints_s.ai_family,uVar9) | 4;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"passive");
  iVar2 = lua_toboolean(L,-1);
  uVar9 = uVar8;
  if (iVar2 != 0) {
    uVar9 = uVar8 | 1;
    hints_s._0_8_ = CONCAT44(hints_s.ai_family,uVar8) | 1;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"numericserv");
  iVar2 = lua_toboolean(L,-1);
  uVar8 = uVar9;
  if (iVar2 != 0) {
    uVar8 = uVar9 | 0x400;
    hints_s._0_8_ = CONCAT44(hints_s.ai_family,uVar9) | 0x400;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "00";
    }
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"canonname");
  iVar2 = lua_toboolean(L,-1);
  if (iVar2 != 0) {
    hints_s._0_8_ = CONCAT44(hints_s.ai_family,uVar8) | 2;
  }
  lua_settop(L,-2);
  hints = &hints_s;
LAB_00149525:
  iVar2 = luv_check_continuation(L,4);
  req = (uv_getaddrinfo_t *)lua_newuserdata(L,0xa0);
  plVar7 = luv_setup_req(L,iVar2);
  req->data = plVar7;
  loop = luv_loop(L);
  cb = (uv_getaddrinfo_cb)0x0;
  if (iVar2 != -2) {
    cb = luv_getaddrinfo_cb;
  }
  iVar3 = uv_getaddrinfo(loop,req,cb,local_70,pcVar4,hints);
  if (iVar3 < 0) {
    luv_cleanup_req(L,(luv_req_t *)req->data);
    lua_settop(L,-2);
    luv_error(L,iVar3);
  }
  else {
    iVar1 = 1;
    if (iVar2 == -2) {
      lua_settop(L,-2);
      luv_pushaddrinfo(L,req->addrinfo);
      uv_freeaddrinfo(req->addrinfo);
      luv_cleanup_req(L,(luv_req_t *)req->data);
    }
  }
  return iVar1;
}

Assistant:

static int luv_getaddrinfo(lua_State* L) {
  uv_getaddrinfo_t* req;
  const char* node;
  const char* service;
  struct addrinfo hints_s;
  struct addrinfo* hints = &hints_s;
  int ret, ref;
  luv_ctx_t* ctx = luv_context(L);
  if (lua_isnoneornil(L, 1)) node = NULL;
  else node = luaL_checkstring(L, 1);
  if (lua_isnoneornil(L, 2)) service = NULL;
  else service = luaL_checkstring(L, 2);
  if (!lua_isnoneornil(L, 3)) luaL_checktype(L, 3, LUA_TTABLE);
  else hints = NULL;
  if (hints) {
    // Initialize the hints
    memset(hints, 0, sizeof(*hints));

    // Process the `family` hint.
    lua_getfield(L, 3, "family");
    if (lua_isnumber(L, -1)) {
      hints->ai_family = lua_tointeger(L, -1);
    }
    else if (lua_isstring(L, -1)) {
      hints->ai_family = luv_af_string_to_num(lua_tostring(L, -1));
    }
    else if (lua_isnil(L, -1)) {
      hints->ai_family = AF_UNSPEC;
    }
    else {
      luaL_argerror(L, 3, "family hint must be string if set");
    }
    lua_pop(L, 1);

    // Process `socktype` hint
    lua_getfield(L, 3, "socktype");
    if (lua_isnumber(L, -1)) {
      hints->ai_socktype = lua_tointeger(L, -1);
    }
    else if (lua_isstring(L, -1)) {
      hints->ai_socktype = luv_sock_string_to_num(lua_tostring(L, -1));
    }
    else if (!lua_isnil(L, -1)) {
      return luaL_argerror(L, 3, "socktype hint must be string if set");
    }
    lua_pop(L, 1);

    // Process the `protocol` hint
    lua_getfield(L, 3, "protocol");
    if (lua_isnumber(L, -1)) {
      hints->ai_protocol = lua_tointeger(L, -1);
    }
    else if (lua_isstring(L, -1)) {
      int protocol = luv_af_string_to_num(lua_tostring(L, -1));
      if (protocol) {
        hints->ai_protocol = protocol;
      }
      else {
        return luaL_argerror(L, 3, "Invalid protocol hint");
      }
    }
    else if (!lua_isnil(L, -1)) {
      return luaL_argerror(L, 3, "protocol hint must be string if set");
    }
    lua_pop(L, 1);

    lua_getfield(L, 3, "addrconfig");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_ADDRCONFIG;
    lua_pop(L, 1);

#ifdef AI_V4MAPPED
    lua_getfield(L, 3, "v4mapped");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_V4MAPPED;
    lua_pop(L, 1);
#endif

#ifdef AI_ALL
    lua_getfield(L, 3, "all");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_ALL;
    lua_pop(L, 1);
#endif

    lua_getfield(L, 3, "numerichost");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_NUMERICHOST;
    lua_pop(L, 1);

    lua_getfield(L, 3, "passive");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_PASSIVE;
    lua_pop(L, 1);

    lua_getfield(L, 3, "numericserv");
    if (lua_toboolean(L, -1)) {
        hints->ai_flags |=  AI_NUMERICSERV;
        /* On OS X upto at least OSX 10.9, getaddrinfo crashes
         * if AI_NUMERICSERV is set and the servname is NULL or "0".
         * This workaround avoids a segfault in libsystem.
         */
        if (NULL == service) service = "00";
    }
    lua_pop(L, 1);

    lua_getfield(L, 3, "canonname");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_CANONNAME;
    lua_pop(L, 1);
  }

  ref = luv_check_continuation(L, 4);
  req = (uv_getaddrinfo_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);

  ret = uv_getaddrinfo(ctx->loop, req, ref == LUA_NOREF ? NULL : luv_getaddrinfo_cb, node, service, hints);
  if (ret < 0) {
    luv_cleanup_req(L, (luv_req_t*)req->data);
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  if (ref == LUA_NOREF) {

    lua_pop(L, 1);
    luv_pushaddrinfo(L, req->addrinfo);
    uv_freeaddrinfo(req->addrinfo);
    luv_cleanup_req(L, (luv_req_t*)req->data);
  }
  return 1;
}